

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lup_matrix.cpp
# Opt level: O2

void __thiscall LUPMatrix::LUPMatrix(LUPMatrix *this,ExtendedMatrix *system)

{
  Matrix *pMVar1;
  Permutation *row_permutation;
  Permutation *column_permutation;
  Matrix MStack_58;
  Matrix local_38;
  
  pMVar1 = ExtendedMatrix::GetExtensionMatrix(system);
  Matrix::GetInverse(&local_38,pMVar1,Without);
  pMVar1 = ExtendedMatrix::GetMainMatrix(system);
  Matrix::Matrix(&MStack_58,pMVar1);
  row_permutation = ExtendedMatrix::GetRowPermutation(system);
  column_permutation = ExtendedMatrix::GetMainColumnPermutation(system);
  LUPMatrix(this,&local_38,&MStack_58,row_permutation,column_permutation);
  std::
  vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ::~vector(&MStack_58.elements_);
  std::
  vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ::~vector(&local_38.elements_);
  return;
}

Assistant:

LUPMatrix::LUPMatrix(const ExtendedMatrix& system)
  : LUPMatrix(system.GetExtensionMatrix().GetInverse(Options::ChoiceType::Without), system.GetMainMatrix(),
              system.GetRowPermutation(), system.GetMainColumnPermutation()) {}